

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int fftkey(char *keyword,int *status)

{
  int iVar1;
  int *in_RSI;
  char *in_RDI;
  char testchar;
  char msg [81];
  int spaces;
  size_t ii;
  size_t maxchr;
  char local_89;
  char local_88 [92];
  int local_2c;
  ulong local_28;
  size_t local_20;
  int *local_18;
  char *local_10;
  int local_4;
  
  local_2c = 0;
  if (*in_RSI < 1) {
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_20 = strlen(in_RDI);
    if (8 < local_20) {
      local_20 = 8;
    }
    for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 1) {
      if (*local_18 == 0) {
        local_89 = local_10[local_28];
      }
      else {
        iVar1 = toupper((int)local_10[local_28]);
        local_89 = (char)iVar1;
      }
      if ((((local_89 < 'A') || ('Z' < local_89)) && ((local_89 < '0' || ('9' < local_89)))) &&
         ((local_89 != '-' && (local_89 != '_')))) {
        if (local_10[local_28] != ' ') {
          if (*local_18 == 0) {
            snprintf(local_88,0x51,"Character %d in this keyword is illegal: %.8s",
                     (ulong)((int)local_28 + 1),local_10);
            ffpmsg((char *)0x165fdd);
            if (local_10[local_28] == '\0') {
              ffpmsg((char *)0x165fff);
            }
            else if (local_10[local_28] == '\t') {
              ffpmsg((char *)0x166023);
            }
          }
          *local_18 = 0xcf;
          return 0xcf;
        }
        local_2c = 1;
      }
      else if (local_2c != 0) {
        if (*local_18 == 0) {
          snprintf(local_88,0x51,"Keyword name contains embedded space(s): %.8s",local_10);
          ffpmsg((char *)0x165f55);
        }
        *local_18 = 0xcf;
        return 0xcf;
      }
    }
    local_4 = *local_18;
  }
  else {
    local_4 = *in_RSI;
  }
  return local_4;
}

Assistant:

int fftkey(const char *keyword,    /* I -  keyword name */
           int *status)      /* IO - error status */
/*
  Test that the keyword name conforms to the FITS standard.  Must contain
  only capital letters, digits, minus or underscore chars.  Trailing spaces
  are allowed.  If the input status value is less than zero, then the test
  is modified so that upper or lower case letters are allowed, and no 
  error messages are printed if the keyword is not legal.
*/
{
    size_t maxchr, ii;
    int spaces=0;
    char msg[FLEN_ERRMSG], testchar;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    maxchr=strlen(keyword);
    if (maxchr > 8)
        maxchr = 8;

    for (ii = 0; ii < maxchr; ii++)
    {
        if (*status == 0)
            testchar = keyword[ii];
        else
            testchar = toupper(keyword[ii]);

        if ( (testchar >= 'A' && testchar <= 'Z') ||
             (testchar >= '0' && testchar <= '9') ||
              testchar == '-' || testchar == '_'   )
              {
                if (spaces)
                {
                  if (*status == 0)
                  {
                     /* don't print error message if status < 0  */
                    snprintf(msg, FLEN_ERRMSG,
                       "Keyword name contains embedded space(s): %.8s",
                        keyword);
                     ffpmsg(msg);
                  }
                  return(*status = BAD_KEYCHAR);        
                }
              }
        else if (keyword[ii] == ' ')
            spaces = 1;

        else     
        {
          if (*status == 0)
          {
            /* don't print error message if status < 0  */
            snprintf(msg, FLEN_ERRMSG,"Character %d in this keyword is illegal: %.8s",
                    (int) (ii+1), keyword);
            ffpmsg(msg);

            /* explicitly flag the 2 most common cases */
            if (keyword[ii] == 0) 
                ffpmsg(" (This a NULL (0) character).");                
            else if (keyword[ii] == 9)
                ffpmsg(" (This an ASCII TAB (9) character).");   
          }             

          return(*status = BAD_KEYCHAR);        
        }                
    }
    return(*status);        
}